

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cleanup_with_absolute_prefix_unittest.cc
# Opt level: O0

void Test_CleanImmediatelyWithAbsolutePrefix_logging::RunTest(void)

{
  ostream *poVar1;
  LogMessage local_f0;
  uint local_90;
  uint i_1;
  LogMessage local_80;
  uint local_1c;
  hours hStack_18;
  uint i;
  minutes local_10;
  
  hStack_18 = h<(char)48>();
  std::chrono::duration<long,std::ratio<60l,1l>>::duration<long,std::ratio<3600l,1l>,void>
            ((duration<long,std::ratio<60l,1l>> *)&local_10,&stack0xffffffffffffffe8);
  google::EnableLogCleaner(&local_10);
  google::SetLogFilenameExtension(".barfoo");
  google::SetLogDestination(GLOG_INFO,"test_cleanup_");
  for (local_1c = 0; local_1c < 1000; local_1c = local_1c + 1) {
    google::LogMessage::LogMessage
              (&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/cleanup_with_absolute_prefix_unittest.cc"
               ,0x40);
    poVar1 = google::LogMessage::stream(&local_80);
    std::operator<<(poVar1,"cleanup test");
    google::LogMessage::~LogMessage(&local_80);
  }
  for (local_90 = 0; local_90 < 10; local_90 = local_90 + 1) {
    google::LogMessage::LogMessage
              (&local_f0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/cleanup_with_absolute_prefix_unittest.cc"
               ,0x44,ERROR);
    poVar1 = google::LogMessage::stream(&local_f0);
    std::operator<<(poVar1,"cleanup test");
    google::LogMessage::~LogMessage(&local_f0);
  }
  google::DisableLogCleaner();
  return;
}

Assistant:

TEST(CleanImmediatelyWithAbsolutePrefix, logging) {
  using namespace std::chrono_literals;
  google::EnableLogCleaner(0h);
  google::SetLogFilenameExtension(".barfoo");
  google::SetLogDestination(GLOG_INFO, "test_cleanup_");

  for (unsigned i = 0; i < 1000; ++i) {
    LOG(INFO) << "cleanup test";
  }

  for (unsigned i = 0; i < 10; ++i) {
    LOG(ERROR) << "cleanup test";
  }

  google::DisableLogCleaner();
}